

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<18,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_b8;
  Matrix<float,_3,_3> local_9c;
  Vector<float,_3> local_78 [2];
  undefined1 local_60 [8];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>((Mat3 *)(in1.m_data.m_data[2].m_data + 1),(MatrixCaseUtils *)evalCtx,
                       (ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    getInputValue<0,9>((Mat3 *)(in1.m_data.m_data[2].m_data + 1),(MatrixCaseUtils *)evalCtx,
                       (ShaderEvalContext *)0x0,in_ECX);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>((Mat3 *)local_60,(MatrixCaseUtils *)evalCtx,
                       (ShaderEvalContext *)&DAT_00000001,in_ECX);
  }
  else {
    getInputValue<0,9>((Mat3 *)local_60,(MatrixCaseUtils *)evalCtx,
                       (ShaderEvalContext *)&DAT_00000001,in_ECX);
  }
  tcu::operator/(&local_9c,(Matrix<float,_3,_3> *)(in1.m_data.m_data[2].m_data + 1),
                 (Matrix<float,_3,_3> *)local_60);
  reduceToVec3((MatrixCaseUtils *)local_78,&local_9c);
  tcu::Vector<float,_4>::xyz(&local_b8,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_b8,local_78);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_9c);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_60);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)(in1.m_data.m_data[2].m_data + 1));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}